

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx *mtctx,size_t srcSize,ZSTD_EndDirective endOp)

{
  size_t *psVar1;
  ZSTD_CCtx_params *__dest;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  undefined8 in_RAX;
  size_t sVar5;
  ZSTD_CDict *pZVar6;
  undefined2 *puVar7;
  uint uVar8;
  ulong uVar9;
  ZSTDMT_jobDescription *pZVar10;
  uint uVar11;
  bool bVar12;
  buffer_t bVar13;
  
  uVar2 = mtctx->jobIDMask;
  uVar8 = uVar2 & mtctx->nextJobID;
  sVar5 = CONCAT71((int7)((ulong)in_RAX >> 8),endOp == ZSTD_e_end);
  if (mtctx->doneJobID + uVar2 < mtctx->nextJobID) {
    if (uVar8 != (mtctx->doneJobID & uVar2)) {
      __assert_fail("(mtctx->nextJobID & mtctx->jobIDMask) == (mtctx->doneJobID & mtctx->jobIDMask)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5099,
                    "size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx *, size_t, ZSTD_EndDirective)");
    }
  }
  else {
    if (mtctx->jobReady == 0) {
      pZVar10 = mtctx->jobs;
      pvVar3 = (mtctx->inBuff).buffer.start;
      pZVar10[uVar8].src.start = pvVar3;
      pZVar10[uVar8].src.size = srcSize;
      if ((mtctx->inBuff).filled < srcSize) {
        __assert_fail("mtctx->inBuff.filled >= srcSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x50a3,
                      "size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx *, size_t, ZSTD_EndDirective)"
                     );
      }
      sVar5 = (mtctx->inBuff).prefix.size;
      pZVar10[uVar8].prefix.start = (mtctx->inBuff).prefix.start;
      pZVar10[uVar8].prefix.size = sVar5;
      __dest = &mtctx->jobs[uVar8].params;
      *(undefined1 (*) [16])((long)(__dest + -2) + 0x58) = ZEXT816(0) << 0x20;
      memcpy(__dest,&mtctx->params,0x90);
      if (mtctx->nextJobID == 0) {
        pZVar6 = mtctx->cdict;
      }
      else {
        pZVar6 = (ZSTD_CDict *)0x0;
      }
      pZVar10 = mtctx->jobs;
      pZVar10[uVar8].cdict = pZVar6;
      pZVar10[uVar8].fullFrameSize = mtctx->frameContentSize;
      pZVar10[uVar8].dstBuff.start = (void *)0x0;
      pZVar10[uVar8].dstBuff.capacity = 0;
      pZVar10 = mtctx->jobs;
      pZVar10[uVar8].cctxPool = mtctx->cctxPool;
      pZVar10[uVar8].bufPool = mtctx->bufPool;
      pZVar10[uVar8].seqPool = mtctx->seqPool;
      pZVar10[uVar8].serial = &mtctx->serial;
      uVar2 = mtctx->nextJobID;
      pZVar10[uVar8].jobID = uVar2;
      pZVar10[uVar8].firstJob = (uint)(uVar2 == 0);
      uVar11 = (uint)(endOp == ZSTD_e_end);
      pZVar10[uVar8].lastJob = uVar11;
      pZVar10[uVar8].frameChecksumNeeded =
           (uint)(((mtctx->params).fParams.checksumFlag != 0 && uVar2 != 0) && endOp == ZSTD_e_end);
      pZVar10[uVar8].dstFlushed = 0;
      psVar1 = &(mtctx->roundBuff).pos;
      *psVar1 = *psVar1 + srcSize;
      (mtctx->inBuff).filled = 0;
      (mtctx->inBuff).buffer.start = (void *)0x0;
      (mtctx->inBuff).buffer.capacity = 0;
      if (endOp == ZSTD_e_end) {
        (mtctx->inBuff).prefix.start = (void *)0x0;
        (mtctx->inBuff).prefix.size = 0;
        mtctx->frameEnded = uVar11;
        if (uVar2 == 0) {
          (mtctx->params).fParams.checksumFlag = 0;
        }
      }
      else {
        uVar9 = mtctx->targetPrefixSize;
        if (srcSize <= mtctx->targetPrefixSize) {
          uVar9 = srcSize;
        }
        (mtctx->inBuff).prefix.start = (void *)((long)pvVar3 + (srcSize - uVar9));
        (mtctx->inBuff).prefix.size = uVar9;
      }
      if (srcSize == 0 && uVar2 != 0) {
        if (endOp != ZSTD_e_end) {
          __assert_fail("endOp == ZSTD_e_end",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x50c9,
                        "size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx *, size_t, ZSTD_EndDirective)"
                       );
        }
        if (pZVar10[uVar8].lastJob != 1) {
          __assert_fail("job->lastJob == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5082,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
        }
        pZVar10 = pZVar10 + uVar8;
        if ((pZVar10->src).size != 0) {
          __assert_fail("job->src.size == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5083,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
        }
        if (pZVar10->firstJob == 0) {
          if ((pZVar10->dstBuff).start != (void *)0x0) {
            __assert_fail("job->dstBuff.start == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x5085,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
          }
          bVar13 = ZSTDMT_getBuffer(pZVar10->bufPool);
          puVar7 = (undefined2 *)bVar13.start;
          pZVar10->dstBuff = bVar13;
          if (puVar7 == (undefined2 *)0x0) {
            pZVar10->cSize = 0xffffffffffffffc0;
          }
          else {
            if (bVar13.capacity < 3) {
              __assert_fail("job->dstBuff.capacity >= ZSTD_blockHeaderSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x508b,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
            }
            (pZVar10->src).start = (void *)0x0;
            (pZVar10->src).size = 0;
            *puVar7 = 1;
            *(undefined1 *)(puVar7 + 1) = 0;
            pZVar10->cSize = 3;
            if (pZVar10->consumed != 0) {
              __assert_fail("job->consumed == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x508f,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
            }
          }
          mtctx->nextJobID = mtctx->nextJobID + 1;
          return (size_t)puVar7;
        }
        __assert_fail("job->firstJob == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x5084,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
      }
    }
    iVar4 = POOL_tryAdd(mtctx->factory,ZSTDMT_compressionJob,mtctx->jobs + uVar8);
    bVar12 = iVar4 == 0;
    if (!bVar12) {
      mtctx->nextJobID = mtctx->nextJobID + 1;
    }
    sVar5 = (size_t)bVar12;
    mtctx->jobReady = (uint)bVar12;
  }
  return sVar5;
}

Assistant:

static size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx* mtctx, size_t srcSize, ZSTD_EndDirective endOp)
{
    unsigned const jobID = mtctx->nextJobID & mtctx->jobIDMask;
    int const endFrame = (endOp == ZSTD_e_end);

    if (mtctx->nextJobID > mtctx->doneJobID + mtctx->jobIDMask) {
        DEBUGLOG(5, "ZSTDMT_createCompressionJob: will not create new job : table is full");
        assert((mtctx->nextJobID & mtctx->jobIDMask) == (mtctx->doneJobID & mtctx->jobIDMask));
        return 0;
    }

    if (!mtctx->jobReady) {
        BYTE const* src = (BYTE const*)mtctx->inBuff.buffer.start;
        DEBUGLOG(5, "ZSTDMT_createCompressionJob: preparing job %u to compress %u bytes with %u preload ",
                    mtctx->nextJobID, (U32)srcSize, (U32)mtctx->inBuff.prefix.size);
        mtctx->jobs[jobID].src.start = src;
        mtctx->jobs[jobID].src.size = srcSize;
        assert(mtctx->inBuff.filled >= srcSize);
        mtctx->jobs[jobID].prefix = mtctx->inBuff.prefix;
        mtctx->jobs[jobID].consumed = 0;
        mtctx->jobs[jobID].cSize = 0;
        mtctx->jobs[jobID].params = mtctx->params;
        mtctx->jobs[jobID].cdict = mtctx->nextJobID==0 ? mtctx->cdict : NULL;
        mtctx->jobs[jobID].fullFrameSize = mtctx->frameContentSize;
        mtctx->jobs[jobID].dstBuff = g_nullBuffer;
        mtctx->jobs[jobID].cctxPool = mtctx->cctxPool;
        mtctx->jobs[jobID].bufPool = mtctx->bufPool;
        mtctx->jobs[jobID].seqPool = mtctx->seqPool;
        mtctx->jobs[jobID].serial = &mtctx->serial;
        mtctx->jobs[jobID].jobID = mtctx->nextJobID;
        mtctx->jobs[jobID].firstJob = (mtctx->nextJobID==0);
        mtctx->jobs[jobID].lastJob = endFrame;
        mtctx->jobs[jobID].frameChecksumNeeded = mtctx->params.fParams.checksumFlag && endFrame && (mtctx->nextJobID>0);
        mtctx->jobs[jobID].dstFlushed = 0;

        /* Update the round buffer pos and clear the input buffer to be reset */
        mtctx->roundBuff.pos += srcSize;
        mtctx->inBuff.buffer = g_nullBuffer;
        mtctx->inBuff.filled = 0;
        /* Set the prefix */
        if (!endFrame) {
            size_t const newPrefixSize = MIN(srcSize, mtctx->targetPrefixSize);
            mtctx->inBuff.prefix.start = src + srcSize - newPrefixSize;
            mtctx->inBuff.prefix.size = newPrefixSize;
        } else {   /* endFrame==1 => no need for another input buffer */
            mtctx->inBuff.prefix = kNullRange;
            mtctx->frameEnded = endFrame;
            if (mtctx->nextJobID == 0) {
                /* single job exception : checksum is already calculated directly within worker thread */
                mtctx->params.fParams.checksumFlag = 0;
        }   }

        if ( (srcSize == 0)
          && (mtctx->nextJobID>0)/*single job must also write frame header*/ ) {
            DEBUGLOG(5, "ZSTDMT_createCompressionJob: creating a last empty block to end frame");
            assert(endOp == ZSTD_e_end);  /* only possible case : need to end the frame with an empty last block */
            ZSTDMT_writeLastEmptyBlock(mtctx->jobs + jobID);
            mtctx->nextJobID++;
            return 0;
        }
    }

    DEBUGLOG(5, "ZSTDMT_createCompressionJob: posting job %u : %u bytes  (end:%u, jobNb == %u (mod:%u))",
                mtctx->nextJobID,
                (U32)mtctx->jobs[jobID].src.size,
                mtctx->jobs[jobID].lastJob,
                mtctx->nextJobID,
                jobID);
    if (POOL_tryAdd(mtctx->factory, ZSTDMT_compressionJob, &mtctx->jobs[jobID])) {
        mtctx->nextJobID++;
        mtctx->jobReady = 0;
    } else {
        DEBUGLOG(5, "ZSTDMT_createCompressionJob: no worker available for job %u", mtctx->nextJobID);
        mtctx->jobReady = 1;
    }
    return 0;
}